

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void set_mi_offsets(CommonModeInfoParams *mi_params,MACROBLOCKD *xd,int mi_row,int mi_col)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  CommonModeInfoParams *in_RDI;
  int mi_alloc_idx;
  int mi_grid_idx;
  
  iVar1 = get_mi_grid_idx(in_RDI,in_EDX,in_ECX);
  iVar2 = get_alloc_mi_idx(in_RDI,in_EDX,in_ECX);
  in_RDI->mi_grid_base[iVar1] = in_RDI->mi_alloc + iVar2;
  *(MB_MODE_INFO ***)(in_RSI + 0x1eb8) = in_RDI->mi_grid_base + iVar1;
  *(TX_TYPE **)(in_RSI + 0x1ee8) = in_RDI->tx_type_map + iVar1;
  *(int *)(in_RSI + 0x1ef0) = in_RDI->mi_stride;
  return;
}

Assistant:

static inline void set_mi_offsets(const CommonModeInfoParams *const mi_params,
                                  MACROBLOCKD *const xd, int mi_row,
                                  int mi_col) {
  // 'mi_grid_base' should point to appropriate memory in 'mi'.
  const int mi_grid_idx = get_mi_grid_idx(mi_params, mi_row, mi_col);
  const int mi_alloc_idx = get_alloc_mi_idx(mi_params, mi_row, mi_col);
  mi_params->mi_grid_base[mi_grid_idx] = &mi_params->mi_alloc[mi_alloc_idx];
  // 'xd->mi' should point to an offset in 'mi_grid_base';
  xd->mi = mi_params->mi_grid_base + mi_grid_idx;
  // 'xd->tx_type_map' should point to an offset in 'mi_params->tx_type_map'.
  xd->tx_type_map = mi_params->tx_type_map + mi_grid_idx;
  xd->tx_type_map_stride = mi_params->mi_stride;
}